

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::to_string_abi_cxx11_(string *__return_storage_ptr__,httplib *this,Error error)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "Success (no error)";
    __a = &local_9;
    break;
  case 1:
    __s = "Unknown";
    __a = &local_16;
    break;
  case 2:
    __s = "Could not establish connection";
    __a = &local_a;
    break;
  case 3:
    __s = "Failed to bind IP address";
    __a = &local_b;
    break;
  case 4:
    __s = "Failed to read connection";
    __a = &local_c;
    break;
  case 5:
    __s = "Failed to write connection";
    __a = &local_d;
    break;
  case 6:
    __s = "Maximum redirect count exceeded";
    __a = &local_e;
    break;
  case 7:
    __s = "Connection handling canceled";
    __a = &local_f;
    break;
  case 8:
    __s = "SSL connection failed";
    __a = &local_10;
    break;
  case 9:
    __s = "SSL certificate loading failed";
    __a = &local_11;
    break;
  case 10:
    __s = "SSL server verification failed";
    __a = &local_12;
    break;
  case 0xb:
    __s = "Unsupported HTTP multipart boundary characters";
    __a = &local_13;
    break;
  case 0xc:
    __s = "Compression failed";
    __a = &local_14;
    break;
  case 0xd:
    __s = "Connection timed out";
    __a = &local_15;
    break;
  default:
    __s = "Invalid";
    __a = &local_17;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Error error) {
  switch (error) {
  case Error::Success: return "Success (no error)";
  case Error::Connection: return "Could not establish connection";
  case Error::BindIPAddress: return "Failed to bind IP address";
  case Error::Read: return "Failed to read connection";
  case Error::Write: return "Failed to write connection";
  case Error::ExceedRedirectCount: return "Maximum redirect count exceeded";
  case Error::Canceled: return "Connection handling canceled";
  case Error::SSLConnection: return "SSL connection failed";
  case Error::SSLLoadingCerts: return "SSL certificate loading failed";
  case Error::SSLServerVerification: return "SSL server verification failed";
  case Error::UnsupportedMultipartBoundaryChars:
    return "Unsupported HTTP multipart boundary characters";
  case Error::Compression: return "Compression failed";
  case Error::ConnectionTimeout: return "Connection timed out";
  case Error::Unknown: return "Unknown";
  default: break;
  }

  return "Invalid";
}